

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *other)

{
  int *piVar1;
  int iVar2;
  SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *mat;
  int iVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Index j;
  long lVar6;
  InnerIterator it;
  IndexVector positions;
  SparseMatrix<double,_0,_int> dest;
  InnerIterator local_a8;
  Matrix<int,__1,_1,_0,__1,_1> local_80;
  SparseMatrix<double,_0,_int> local_70;
  
  mat = *(SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> **)(other + 8);
  SparseMatrix<double,_0,_int>::SparseMatrix(&local_70,*(Index *)(mat + 8),*(Index *)(mat + 0x10));
  local_a8.m_values = (Scalar *)local_70.m_outerIndex;
  local_a8.m_indices = (StorageIndex *)local_70.m_outerSize;
  DenseBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::setZero
            ((DenseBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *
             )&local_a8);
  for (lVar6 = 0; lVar6 < *(long *)(mat + 8); lVar6 = lVar6 + 1) {
    SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
              (&local_a8,mat,lVar6);
    for (; local_a8.m_id < local_a8.m_end; local_a8.m_id = local_a8.m_id + 1) {
      piVar1 = (int *)((long)local_70.m_outerIndex +
                      (long)*(int *)((long)local_a8.m_indices + local_a8.m_id * 4) * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  local_a8.m_values = (Scalar *)local_70.m_outerSize;
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<long>(&local_80,(long *)&local_a8);
  pSVar4 = (Scalar *)0x0;
  if (0 < local_70.m_outerSize) {
    pSVar4 = (Scalar *)local_70.m_outerSize;
  }
  iVar3 = 0;
  for (pSVar5 = (Scalar *)0x0; pSVar4 != pSVar5; pSVar5 = (Scalar *)((long)pSVar5 + 1)) {
    iVar2 = *(int *)((long)local_70.m_outerIndex + (long)pSVar5 * 4);
    *(int *)((long)local_70.m_outerIndex + (long)pSVar5 * 4) = iVar3;
    local_80.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
    [(long)pSVar5] = iVar3;
    iVar3 = iVar2 + iVar3;
  }
  *(int *)((long)local_70.m_outerIndex + local_70.m_outerSize * 4) = iVar3;
  internal::CompressedStorage<double,_int>::resize(&local_70.m_data,(long)iVar3,0.0);
  for (lVar6 = 0; lVar6 < *(long *)(mat + 8); lVar6 = lVar6 + 1) {
    SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
              (&local_a8,mat,lVar6);
    for (; local_a8.m_id < local_a8.m_end; local_a8.m_id = local_a8.m_id + 1) {
      iVar3 = *(int *)((long)local_a8.m_indices + local_a8.m_id * 4);
      iVar2 = local_80.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [iVar3];
      local_80.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data[iVar3] =
           iVar2 + 1;
      local_70.m_data.m_indices[iVar2] = (StorageIndex)lVar6;
      local_70.m_data.m_values[iVar2] = local_a8.m_values[local_a8.m_id];
    }
  }
  SparseMatrix<double,_0,_int>::swap((SparseMatrix<double,_0,_int> *)this,&local_70);
  free(local_80.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  SparseMatrix<double,_0,_int>::~SparseMatrix(&local_70);
  return (SparseMatrix<double,_0,_int> *)this;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_StorageIndex>& SparseMatrix<Scalar,_Options,_StorageIndex>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)

  #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
    EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
  #endif
      
  const bool needToTranspose = (Flags & RowMajorBit) != (internal::evaluator<OtherDerived>::Flags & RowMajorBit);
  if (needToTranspose)
  {
    #ifdef EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
      EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
    #endif
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested_eval<OtherDerived,2,typename internal::plain_matrix_type<OtherDerived>::type >::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    typedef internal::evaluator<_OtherCopy> OtherCopyEval;
    OtherCopy otherCopy(other.derived());
    OtherCopyEval otherCopyEval(otherCopy);

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<IndexVector> (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    StorageIndex count = 0;
    IndexVector positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      StorageIndex tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (StorageIndex j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
    {
      initAssignment(other.derived());
    }
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}